

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bad_fd.c
# Opt level: O0

void test_bad_fd(void)

{
  archive *v1;
  undefined4 unaff_retaddr;
  wchar_t unaff_retaddr_00;
  char *in_stack_00000008;
  archive *a;
  void *in_stack_00000020;
  size_t in_stack_00000088;
  int in_stack_00000094;
  archive *in_stack_00000098;
  archive *in_stack_ffffffffffffffe8;
  char *in_stack_fffffffffffffff0;
  
  v1 = archive_read_new();
  assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(wchar_t)((ulong)v1 >> 0x20),
                   (wchar_t)v1,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  archive_read_support_filter_all(in_stack_ffffffffffffffe8);
  assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(wchar_t)((ulong)v1 >> 0x20),
                   (wchar_t)v1,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  archive_read_open_fd(in_stack_00000098,in_stack_00000094,in_stack_00000088);
  assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(wchar_t)((ulong)v1 >> 0x20),
                   (wchar_t)v1,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  archive_read_close((archive *)0x13fa98);
  assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)v1,in_stack_fffffffffffffff0,
                      (longlong)v1,(char *)0x13fac7,in_stack_00000020);
  archive_read_free((archive *)0x13fad1);
  assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)v1,in_stack_fffffffffffffff0,0,
                      (char *)0x13faff,in_stack_00000020);
  return;
}

Assistant:

DEFINE_TEST(test_bad_fd)
{
	struct archive *a;
	assert((a = archive_read_new()) != NULL);
	assertA(0 == archive_read_support_filter_all(a));
	assertA(ARCHIVE_FATAL == archive_read_open_fd(a, -1, 1024));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}